

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayout::paintSeparators
          (QDockAreaLayout *this,QPainter *p,QWidget *widget,QRegion *clip,QPoint *mouse)

{
  QDockAreaLayoutInfo *this_00;
  int iVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  QRect *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &this->docks[0].rect;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    this_00 = (QDockAreaLayoutInfo *)((long)(pQVar5 + -3) + 8);
    bVar2 = QDockAreaLayoutInfo::isEmpty(this_00);
    if (!bVar2) {
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = (undefined1  [16])separatorRect(this,(int)lVar4);
      cVar3 = QRegion::contains((QRect *)clip);
      if (cVar3 != '\0') {
        bVar2 = QDockAreaLayoutInfo::hasFixedSize(this_00);
        if (!bVar2) {
          iVar1 = *(int *)((long)(pQVar5 + -1) + 0xc);
          bVar2 = (bool)QRect::contains((QPoint *)local_48,SUB81(mouse,0));
          paintSep(p,widget,(QRect *)local_48,(iVar1 == 1) + Horizontal,bVar2);
        }
      }
      cVar3 = QRegion::contains((QRect *)clip);
      if (cVar3 != '\0') {
        QDockAreaLayoutInfo::paintSeparators(this_00,p,widget,clip,mouse);
      }
    }
    pQVar5 = pQVar5 + 7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::paintSeparators(QPainter *p, QWidget *widget,
                                                const QRegion &clip,
                                                const QPoint &mouse) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        QRect r = separatorRect(i);
        if (clip.contains(r) && !dock.hasFixedSize()) {
            Qt::Orientation opposite = dock.o == Qt::Horizontal
                                        ? Qt::Vertical : Qt::Horizontal;
            paintSep(p, widget, r, opposite, r.contains(mouse));
        }
        if (clip.contains(dock.rect))
            dock.paintSeparators(p, widget, clip, mouse);
    }
}